

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::IntegerLiteral::IntegerLiteral
          (IntegerLiteral *this,BumpAllocator *alloc,Type *type,SVInt *value,bool isDeclaredUnsized,
          SourceRange sourceRange)

{
  bool bVar1;
  bitwidth_t bVar2;
  uint uVar3;
  SVInt *pSVar4;
  bool bVar5;
  ulong size;
  byte *__dest;
  
  (this->super_Expression).kind = IntegerLiteral;
  (this->super_Expression).type.ptr = type;
  (this->super_Expression).constant = (ConstantValue *)0x0;
  (this->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (this->super_Expression).sourceRange.startLoc = sourceRange.startLoc;
  (this->super_Expression).sourceRange.endLoc = sourceRange.endLoc;
  this->isDeclaredUnsized = isDeclaredUnsized;
  bVar2 = (value->super_SVIntStorage).bitWidth;
  bVar1 = (value->super_SVIntStorage).signFlag;
  bVar5 = (value->super_SVIntStorage).unknownFlag;
  (this->valueStorage).field_0.val = 0;
  (this->valueStorage).bitWidth = bVar2;
  (this->valueStorage).signFlag = bVar1;
  (this->valueStorage).unknownFlag = bVar5;
  uVar3 = (value->super_SVIntStorage).bitWidth;
  bVar1 = (value->super_SVIntStorage).unknownFlag;
  if (0x40 < uVar3 || (bVar1 & 1U) != 0) {
    size = (ulong)(((uVar3 + 0x3f >> 6) << (bVar1 & 0x1fU)) << 3);
    __dest = (byte *)((ulong)(alloc->head->current + 7) & 0xfffffffffffffff8);
    if (alloc->endPtr < __dest + size) {
      __dest = BumpAllocator::allocateSlow(alloc,size,8);
    }
    else {
      alloc->head->current = __dest + size;
    }
    (this->valueStorage).field_0.pVal = (uint64_t *)__dest;
    uVar3 = (value->super_SVIntStorage).bitWidth;
    bVar1 = (value->super_SVIntStorage).unknownFlag;
    pSVar4 = (SVInt *)(value->super_SVIntStorage).field_0.pVal;
    if ((bVar1 & 1U) != 0) {
      value = pSVar4;
    }
    if (0x40 < uVar3) {
      value = pSVar4;
    }
    memcpy(__dest,value,(ulong)(((uVar3 + 0x3f >> 6) << (bVar1 & 0x1fU)) << 3));
    return;
  }
  (this->valueStorage).field_0 = (value->super_SVIntStorage).field_0;
  return;
}

Assistant:

IntegerLiteral::IntegerLiteral(BumpAllocator& alloc, const Type& type, const SVInt& value,
                               bool isDeclaredUnsized, SourceRange sourceRange) :
    Expression(ExpressionKind::IntegerLiteral, type, sourceRange),
    isDeclaredUnsized(isDeclaredUnsized),
    valueStorage(value.getBitWidth(), value.isSigned(), value.hasUnknown()) {

    if (value.isSingleWord())
        valueStorage.val = *value.getRawPtr();
    else {
        valueStorage.pVal = (uint64_t*)alloc.allocate(sizeof(uint64_t) * value.getNumWords(),
                                                      alignof(uint64_t));
        memcpy(valueStorage.pVal, value.getRawPtr(), sizeof(uint64_t) * value.getNumWords());
    }
}